

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

bool testing::internal::ParseInt32(Message *src_text,char *str,int32_t *value)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  Message msg;
  char *end;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  string local_48;
  char *local_28;
  
  local_28 = (char *)0x0;
  lVar2 = strtol(str,&local_28,10);
  if (*local_28 == '\0') {
    if ((int)lVar2 == lVar2) {
      *value = (int)lVar2;
      return true;
    }
    Message::Message((Message *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),"WARNING: ",9);
    _Var1._M_head_impl = local_50._M_head_impl;
    StringStreamToString
              (&local_48,
               (src_text->ss_)._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(_Var1._M_head_impl + 0x10),local_48._M_dataplus._M_p,
               local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),
               " is expected to be a 32-bit integer, but actually",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10)," has value ",0xb);
    poVar4 = (ostream *)(local_50._M_head_impl + 0x10);
    if (str == (char *)0x0) {
      sVar3 = 6;
      str = "(null)";
    }
    else {
      sVar3 = strlen(str);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,str,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),", which overflows.\n",0x13);
    StringStreamToString(&local_48,local_50._M_head_impl);
  }
  else {
    Message::Message((Message *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),"WARNING: ",9);
    _Var1._M_head_impl = local_50._M_head_impl;
    StringStreamToString
              (&local_48,
               (src_text->ss_)._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(_Var1._M_head_impl + 0x10),local_48._M_dataplus._M_p,
               local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),
               " is expected to be a 32-bit integer, but actually",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10)," has value \"",0xc);
    poVar4 = (ostream *)(local_50._M_head_impl + 0x10);
    if (str == (char *)0x0) {
      sVar3 = 6;
      str = "(null)";
    }
    else {
      sVar3 = strlen(str);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,str,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),"\".\n",3);
    StringStreamToString(&local_48,local_50._M_head_impl);
  }
  printf("%s",local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  fflush(_stdout);
  if (local_50._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  return false;
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, int32_t* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an int32_t?
  const auto result = static_cast<int32_t>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an int32_t.
      ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value " << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}